

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddWindow.c
# Opt level: O1

int ddWindowConv3(DdManager *table,int low,int high)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  void *__ptr;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  
  iVar7 = high - low;
  if (iVar7 < 2) {
    iVar7 = ddWindowConv2(table,low,high);
    return iVar7;
  }
  uVar1 = iVar7 - 1;
  __ptr = malloc((ulong)uVar1 * 4);
  if (__ptr == (void *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
LAB_007ee5ad:
    iVar7 = 0;
  }
  else {
    uVar4 = 1;
    if (1 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    uVar6 = 0;
    do {
      *(undefined4 *)((long)__ptr + uVar6 * 4) = 1;
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
    uVar4 = 1;
    if (1 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    do {
      uVar6 = 0;
      bVar2 = false;
      do {
        if (*(int *)((long)__ptr + uVar6 * 4) != 0) {
          iVar3 = ddPermuteWindow3(table,(int)uVar6 + low);
          switch(iVar3) {
          case 1:
            goto switchD_007ee4ec_caseD_1;
          case 2:
            if ((long)uVar6 < (long)(iVar7 + -2)) {
              *(undefined4 *)((long)__ptr + uVar6 * 4 + 4) = 1;
            }
            break;
          case 3:
          case 4:
          case 5:
            if ((long)uVar6 < (long)(iVar7 + -3)) {
              *(undefined4 *)((long)__ptr + uVar6 * 4 + 8) = 1;
            }
            if ((long)uVar6 < (long)(iVar7 + -2)) {
              *(undefined4 *)((long)__ptr + uVar6 * 4 + 4) = 1;
            }
            if (uVar6 != 0) {
              *(undefined4 *)((long)__ptr + uVar6 * 4 + -4) = 1;
            }
            break;
          case 6:
            if ((long)uVar6 < (long)(iVar7 + -3)) {
              *(undefined4 *)((long)__ptr + uVar6 * 4 + 8) = 1;
            }
            lVar5 = -4;
            if (uVar6 != 0) goto LAB_007ee55c;
            goto LAB_007ee567;
          default:
            free(__ptr);
            goto LAB_007ee5ad;
          }
          bVar2 = true;
          lVar5 = -8;
          if (1 < uVar6) {
LAB_007ee55c:
            *(undefined4 *)((long)__ptr + uVar6 * 4 + lVar5) = 1;
LAB_007ee567:
            bVar2 = true;
          }
switchD_007ee4ec_caseD_1:
          *(undefined4 *)((long)__ptr + uVar6 * 4) = 0;
        }
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    } while (bVar2);
    free(__ptr);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

static int
ddWindowConv3(
  DdManager * table,
  int  low,
  int  high)
{
    int x;
    int res;
    int nwin;
    int newevent;
    int *events;

#ifdef DD_DEBUG
    assert(low >= 0 && high < table->size);
#endif

    if (high-low < 2) return(ddWindowConv2(table,low,high));

    nwin = high-low-1;
    events = ABC_ALLOC(int,nwin);
    if (events == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (x=0; x<nwin; x++) {
        events[x] = 1;
    }

    do {
        newevent = 0;
        for (x=0; x<nwin; x++) {
            if (events[x]) {
                res = ddPermuteWindow3(table,x+low);
                switch (res) {
                case ABC:
                    break;
                case BAC:
                    if (x < nwin-1)     events[x+1] = 1;
                    if (x > 1)          events[x-2] = 1;
                    newevent = 1;
                    break;
                case BCA:
                case CBA:
                case CAB:
                    if (x < nwin-2)     events[x+2] = 1;
                    if (x < nwin-1)     events[x+1] = 1;
                    if (x > 0)          events[x-1] = 1;
                    if (x > 1)          events[x-2] = 1;
                    newevent = 1;
                    break;
                case ACB:
                    if (x < nwin-2)     events[x+2] = 1;
                    if (x > 0)          events[x-1] = 1;
                    newevent = 1;
                    break;
                default:
                    ABC_FREE(events);
                    return(0);
                }
                events[x] = 0;
#ifdef DD_STATS
                if (res == ABC) {
                    (void) fprintf(table->out,"=");
                } else {
                    (void) fprintf(table->out,"-");
                }
                fflush(table->out);
#endif
            }
        }
#ifdef DD_STATS
        if (newevent) {
            (void) fprintf(table->out,"|");
            fflush(table->out);
        }
#endif
    } while (newevent);

    ABC_FREE(events);

    return(1);

}